

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ReportLastSystemError(char *msg)

{
  size_t sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string m;
  string local_88;
  long *local_68;
  undefined8 local_60;
  long local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  long *local_20;
  
  sVar1 = strlen(msg);
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  local_38 = 0x10;
  local_30 = ": System Error: ";
  local_28 = local_60;
  local_20 = local_68;
  views._M_len = 3;
  views._M_array = &local_48;
  local_48._M_len = sVar1;
  local_48._M_str = msg;
  cmCatViews_abi_cxx11_(&local_88,views);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  Error(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}